

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave-common-sdl2.cpp
# Opt level: O2

bool GGWave_init(int playbackId,int captureId,int payloadLength,float sampleRateOffset,bool useDSS)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  SDL_AudioSpec playbackSpec;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((anonymous_namespace)::g_devIdInp != 0 && (anonymous_namespace)::g_devIdOut != 0) {
    return false;
  }
  if ((anonymous_namespace)::g_devIdInp == 0 && (anonymous_namespace)::g_devIdOut == 0) {
    SDL_LogSetPriority(0,3);
    iVar2 = SDL_Init(0x10);
    if (iVar2 < 0) {
      uVar4 = SDL_GetError();
      SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar4);
      return true;
    }
    SDL_SetHintWithPriority("SDL_AUDIO_RESAMPLING_MODE","medium",2);
    uVar3 = SDL_GetNumAudioDevices(0);
    printf("Found %d playback devices:\n",(ulong)uVar3);
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      uVar4 = SDL_GetAudioDeviceName(uVar6,0);
      printf("    - Playback device #%d: \'%s\'\n",(ulong)uVar6,uVar4);
    }
    uVar3 = SDL_GetNumAudioDevices(1);
    printf("Found %d capture devices:\n",(ulong)uVar3);
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    for (uVar7 = 0; uVar3 != (uint)uVar7; uVar7 = (ulong)((uint)uVar7 + 1)) {
      uVar4 = SDL_GetAudioDeviceName(uVar7,1);
      printf("    - Capture device #%d: \'%s\'\n",uVar7,uVar4);
    }
  }
  if ((anonymous_namespace)::g_devIdOut == 0) {
    puts("Initializing playback ...");
    SDL_memset(&playbackSpec,0,0x20);
    playbackSpec.freq = (int)(sampleRateOffset + 48000.0);
    playbackSpec.format = 0x8010;
    playbackSpec.channels = '\x01';
    playbackSpec.samples = 0x4000;
    playbackSpec.callback._0_4_ = 0;
    playbackSpec.callback._4_4_ = 0;
    SDL_memset(&(anonymous_namespace)::g_obtainedSpecOut,0,0x20);
    if (playbackId < 0) {
      puts("Attempt to open default playback device ...");
      uVar4 = 0;
    }
    else {
      uVar4 = SDL_GetAudioDeviceName(playbackId,0);
      printf("Attempt to open playback device %d : \'%s\' ...\n",(ulong)(uint)playbackId,uVar4);
      uVar4 = SDL_GetAudioDeviceName(playbackId,0);
    }
    (anonymous_namespace)::g_devIdOut =
         SDL_OpenAudioDevice(uVar4,0,&playbackSpec,&(anonymous_namespace)::g_obtainedSpecOut,0);
    bVar1 = (anonymous_namespace)::g_devIdOut != 0;
    if ((anonymous_namespace)::g_devIdOut == 0) {
      uVar4 = SDL_GetError();
      printf("Couldn\'t open an audio device for playback: %s!\n",uVar4);
      (anonymous_namespace)::g_devIdOut = 0;
    }
    else {
      printf("Obtained spec for output device (SDL Id = %d):\n",
             (ulong)(anonymous_namespace)::g_devIdOut);
      printf("    - Sample rate:       %d (required: %d)\n",
             (ulong)(anonymous_namespace)::g_obtainedSpecOut,(ulong)(uint)playbackSpec.freq);
      printf("    - Format:            %d (required: %d)\n",(ulong)DAT_001092ec,
             (ulong)playbackSpec.format);
      printf("    - Channels:          %d (required: %d)\n",(ulong)DAT_001092ee,
             (ulong)playbackSpec.channels);
      printf("    - Samples per frame: %d (required: %d)\n",(ulong)DAT_001092f0,
             (ulong)playbackSpec.samples);
      if (((DAT_001092ec != playbackSpec.format) || (DAT_001092ee != playbackSpec.channels)) ||
         (DAT_001092f0 != playbackSpec.samples)) {
        (anonymous_namespace)::g_devIdOut = 0;
        SDL_CloseAudio();
        fwrite("Failed to initialize playback SDL_OpenAudio!",0x2c,1,_stderr);
        return false;
      }
    }
  }
  else {
    bVar1 = false;
  }
  if ((anonymous_namespace)::g_devIdInp == 0) {
    playbackSpec.channels = DAT_001092ee;
    playbackSpec.silence = URam00000000001092ef;
    playbackSpec.padding = (Uint16)uRam00000000001092f2;
    playbackSpec.size = (Uint32)((uint6)uRam00000000001092f2 >> 0x10);
    playbackSpec.freq = (int)(sampleRateOffset + 48000.0);
    playbackSpec.callback._0_4_ = _DAT_001092f8;
    playbackSpec.callback._4_4_ = uRam00000000001092fc;
    playbackSpec.userdata._0_4_ = uRam0000000000109300;
    playbackSpec.userdata._4_4_ = uRam0000000000109304;
    playbackSpec.format = 0x8120;
    playbackSpec.samples = 0x400;
    SDL_memset(&(anonymous_namespace)::g_obtainedSpecInp,0,0x20);
    if (captureId < 0) {
      puts("Attempt to open default capture device ...");
      lVar5 = _DAT_001092b8;
      if (_DAT_001092b8 != 0) {
        lVar5 = (anonymous_namespace)::g_defaultCaptureDeviceName_abi_cxx11_;
      }
    }
    else {
      uVar4 = SDL_GetAudioDeviceName(captureId,1);
      printf("Attempt to open capture device %d : \'%s\' ...\n",(ulong)(uint)captureId,uVar4);
      lVar5 = SDL_GetAudioDeviceName(captureId,1);
    }
    (anonymous_namespace)::g_devIdInp =
         SDL_OpenAudioDevice(lVar5,1,&playbackSpec,&(anonymous_namespace)::g_obtainedSpecInp,0);
    if ((anonymous_namespace)::g_devIdInp == 0) {
      uVar4 = SDL_GetError();
      printf("Couldn\'t open an audio device for capture: %s!\n",uVar4);
      (anonymous_namespace)::g_devIdInp = 0;
    }
    else {
      printf("Obtained spec for input device (SDL Id = %d):\n",
             (ulong)(anonymous_namespace)::g_devIdInp);
      printf("    - Sample rate:       %d\n",(ulong)(anonymous_namespace)::g_obtainedSpecInp);
      printf("    - Format:            %d (required: %d)\n",(ulong)DAT_00109314,
             (ulong)playbackSpec.format);
      printf("    - Channels:          %d (required: %d)\n",(ulong)DAT_00109316,
             (ulong)playbackSpec.channels);
      printf("    - Samples per frame: %d\n",(ulong)DAT_00109318);
      bVar1 = true;
    }
  }
  playbackSpec.userdata._0_4_ = 5;
  if (DAT_00109314 != 0x8120) {
    if (DAT_00109314 == 0x10) {
      playbackSpec.userdata._0_4_ = 3;
    }
    else if (DAT_00109314 == 0x8008) {
      playbackSpec.userdata._0_4_ = 2;
    }
    else if (DAT_00109314 == 0x8010) {
      playbackSpec.userdata._0_4_ = 4;
    }
    else if ((DAT_00109314 != 0x8020) && (playbackSpec.userdata._0_4_ = 0, DAT_00109314 == 8)) {
      playbackSpec.userdata._0_4_ = 1;
    }
  }
  if (DAT_001092ec != 0x8120) {
    if (DAT_001092ec == 0x10) {
      playbackSpec.userdata._4_4_ = 3;
      goto LAB_00104c23;
    }
    if (DAT_001092ec == 0x8008) {
      playbackSpec.userdata._4_4_ = 2;
      goto LAB_00104c23;
    }
    if (DAT_001092ec == 0x8010) {
      playbackSpec.userdata._4_4_ = 4;
      goto LAB_00104c23;
    }
    if (DAT_001092ec != 0x8020) {
      playbackSpec.userdata._4_4_ = 0;
      if (DAT_001092ec == 8) {
        playbackSpec.userdata._4_4_ = 1;
      }
      goto LAB_00104c23;
    }
  }
  playbackSpec.userdata._4_4_ = 5;
LAB_00104c23:
  if (bVar1) {
    fVar8 = (float)(int)(anonymous_namespace)::g_obtainedSpecInp;
    playbackSpec._8_4_ = (BADTYPE)(int)(anonymous_namespace)::g_obtainedSpecOut;
    playbackSpec.format = SUB42(fVar8,0);
    playbackSpec.channels = (Uint8)((uint)fVar8 >> 0x10);
    playbackSpec.silence = (Uint8)((uint)fVar8 >> 0x18);
    playbackSpec.size = 0x473b8000;
    playbackSpec.callback._0_4_ = 0x400;
    playbackSpec.callback._4_4_ = 0x40400000;
    playbackSpec.freq = payloadLength;
    std::make_shared<GGWave,ggwave_Parameters>((ggwave_Parameters *)&stack0xffffffffffffffc0);
    std::__shared_ptr<GGWave,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<GGWave,_(__gnu_cxx::_Lock_policy)2> *)&(anonymous_namespace)::g_ggWave,
               (__shared_ptr<GGWave,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  return true;
}

Assistant:

bool GGWave_init(
        const int playbackId,
        const int captureId,
        const int payloadLength,
        const float sampleRateOffset,
        const bool useDSS) {

    if (g_devIdInp && g_devIdOut) {
        return false;
    }

    if (g_devIdInp == 0 && g_devIdOut == 0) {
        SDL_LogSetPriority(SDL_LOG_CATEGORY_APPLICATION, SDL_LOG_PRIORITY_INFO);

        if (SDL_Init(SDL_INIT_AUDIO) < 0) {
            SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
            return (1);
        }

        SDL_SetHintWithPriority(SDL_HINT_AUDIO_RESAMPLING_MODE, "medium", SDL_HINT_OVERRIDE);

        {
            int nDevices = SDL_GetNumAudioDevices(SDL_FALSE);
            printf("Found %d playback devices:\n", nDevices);
            for (int i = 0; i < nDevices; i++) {
                printf("    - Playback device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_FALSE));
            }
        }
        {
            int nDevices = SDL_GetNumAudioDevices(SDL_TRUE);
            printf("Found %d capture devices:\n", nDevices);
            for (int i = 0; i < nDevices; i++) {
                printf("    - Capture device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_TRUE));
            }
        }
    }

    bool reinit = false;

    if (g_devIdOut == 0) {
        printf("Initializing playback ...\n");

        SDL_AudioSpec playbackSpec;
        SDL_zero(playbackSpec);

        playbackSpec.freq = GGWave::kDefaultSampleRate + sampleRateOffset;
        playbackSpec.format = AUDIO_S16SYS;
        playbackSpec.channels = 1;
        playbackSpec.samples = 16*1024;
        playbackSpec.callback = NULL;

        SDL_zero(g_obtainedSpecOut);

        if (playbackId >= 0) {
            printf("Attempt to open playback device %d : '%s' ...\n", playbackId, SDL_GetAudioDeviceName(playbackId, SDL_FALSE));
            g_devIdOut = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(playbackId, SDL_FALSE), SDL_FALSE, &playbackSpec, &g_obtainedSpecOut, 0);
        } else {
            printf("Attempt to open default playback device ...\n");
            g_devIdOut = SDL_OpenAudioDevice(NULL, SDL_FALSE, &playbackSpec, &g_obtainedSpecOut, 0);
        }

        if (!g_devIdOut) {
            printf("Couldn't open an audio device for playback: %s!\n", SDL_GetError());
            g_devIdOut = 0;
        } else {
            printf("Obtained spec for output device (SDL Id = %d):\n", g_devIdOut);
            printf("    - Sample rate:       %d (required: %d)\n", g_obtainedSpecOut.freq, playbackSpec.freq);
            printf("    - Format:            %d (required: %d)\n", g_obtainedSpecOut.format, playbackSpec.format);
            printf("    - Channels:          %d (required: %d)\n", g_obtainedSpecOut.channels, playbackSpec.channels);
            printf("    - Samples per frame: %d (required: %d)\n", g_obtainedSpecOut.samples, playbackSpec.samples);

            if (g_obtainedSpecOut.format != playbackSpec.format ||
                g_obtainedSpecOut.channels != playbackSpec.channels ||
                g_obtainedSpecOut.samples != playbackSpec.samples) {
                g_devIdOut = 0;
                SDL_CloseAudio();
                fprintf(stderr, "Failed to initialize playback SDL_OpenAudio!");

                return false;
            }

            reinit = true;
        }
    }

    if (g_devIdInp == 0) {
        SDL_AudioSpec captureSpec;
        captureSpec = g_obtainedSpecOut;
        captureSpec.freq = GGWave::kDefaultSampleRate + sampleRateOffset;
        captureSpec.format = AUDIO_F32SYS;
        captureSpec.samples = 1024;

        SDL_zero(g_obtainedSpecInp);

        if (captureId >= 0) {
            printf("Attempt to open capture device %d : '%s' ...\n", captureId, SDL_GetAudioDeviceName(captureId, SDL_TRUE));
            g_devIdInp = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(captureId, SDL_TRUE), SDL_TRUE, &captureSpec, &g_obtainedSpecInp, 0);
        } else {
            printf("Attempt to open default capture device ...\n");
            g_devIdInp = SDL_OpenAudioDevice(g_defaultCaptureDeviceName.empty() ? nullptr : g_defaultCaptureDeviceName.c_str(),
                                            SDL_TRUE, &captureSpec, &g_obtainedSpecInp, 0);
        }
        if (!g_devIdInp) {
            printf("Couldn't open an audio device for capture: %s!\n", SDL_GetError());
            g_devIdInp = 0;
        } else {
            printf("Obtained spec for input device (SDL Id = %d):\n", g_devIdInp);
            printf("    - Sample rate:       %d\n", g_obtainedSpecInp.freq);
            printf("    - Format:            %d (required: %d)\n", g_obtainedSpecInp.format, captureSpec.format);
            printf("    - Channels:          %d (required: %d)\n", g_obtainedSpecInp.channels, captureSpec.channels);
            printf("    - Samples per frame: %d\n", g_obtainedSpecInp.samples);

            reinit = true;
        }
    }

    GGWave::SampleFormat sampleFormatInp = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
    GGWave::SampleFormat sampleFormatOut = GGWAVE_SAMPLE_FORMAT_UNDEFINED;

    switch (g_obtainedSpecInp.format) {
        case AUDIO_U8:      sampleFormatInp = GGWAVE_SAMPLE_FORMAT_U8;  break;
        case AUDIO_S8:      sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I8;  break;
        case AUDIO_U16SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_U16; break;
        case AUDIO_S16SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I16; break;
        case AUDIO_S32SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_F32; break;
        case AUDIO_F32SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_F32; break;
    }

    switch (g_obtainedSpecOut.format) {
        case AUDIO_U8:      sampleFormatOut = GGWAVE_SAMPLE_FORMAT_U8;  break;
        case AUDIO_S8:      sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I8;  break;
        case AUDIO_U16SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_U16; break;
        case AUDIO_S16SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I16; break;
        case AUDIO_S32SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_F32; break;
        case AUDIO_F32SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_F32; break;
            break;
    }

    if (reinit) {
        GGWave::OperatingMode mode = GGWAVE_OPERATING_MODE_RX_AND_TX;
        if (useDSS) mode |= GGWAVE_OPERATING_MODE_USE_DSS;

        g_ggWave = std::make_shared<GGWave>(GGWave::Parameters {
            payloadLength,
            (float) g_obtainedSpecInp.freq,
            (float) g_obtainedSpecOut.freq,
            GGWave::kDefaultSampleRate,
            GGWave::kDefaultSamplesPerFrame,
            GGWave::kDefaultSoundMarkerThreshold,
            sampleFormatInp,
            sampleFormatOut,
            mode,
        });
    }

    return true;
}